

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

_Bool run_container_contains_range(run_container_t *run,uint32_t pos_start,uint32_t pos_end)

{
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  uint32_t min;
  uint32_t stop;
  int32_t i;
  int32_t index;
  uint32_t count;
  uint local_38;
  uint local_34;
  int local_30;
  int32_t local_24;
  int32_t local_20;
  uint local_1c;
  _Bool local_1;
  
  local_1c = 0;
  local_20 = interleavedBinarySearch(*(rle16_t **)(in_RDI + 2),*in_RDI,(uint16_t)in_ESI);
  if ((local_20 < 0) &&
     ((local_20 = -2 - local_20, local_20 == -1 ||
      ((uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4) <
       in_ESI - *(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 4))))) {
    local_1 = false;
  }
  else {
    local_24 = local_20;
    while( true ) {
      if ((*in_RDI <= local_24) ||
         (local_34 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4) +
                     (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4),
         in_EDX <= *(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4))) goto LAB_0012ab9e;
      if (in_EDX <= local_34) break;
      if (local_34 == in_ESI) {
        local_34 = 0;
      }
      else {
        local_34 = local_34 - in_ESI;
      }
      if (local_34 < *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4)) {
        local_38 = local_34;
      }
      else {
        local_38 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4);
      }
      local_1c = local_38 + local_1c;
      local_24 = local_24 + 1;
    }
    if (in_EDX == *(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4)) {
      local_30 = 0;
    }
    else {
      local_30 = in_EDX - *(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4);
    }
    local_1c = local_30 + local_1c;
LAB_0012ab9e:
    local_1 = (in_EDX - in_ESI) - 1 <= local_1c;
  }
  return local_1;
}

Assistant:

static inline bool run_container_contains_range(const run_container_t *run,
                                                uint32_t pos_start,
                                                uint32_t pos_end) {
    uint32_t count = 0;
    int32_t index =
        interleavedBinarySearch(run->runs, run->n_runs, (uint16_t)pos_start);
    if (index < 0) {
        index = -index - 2;
        if ((index == -1) ||
            ((pos_start - run->runs[index].value) > run->runs[index].length)) {
            return false;
        }
    }
    for (int32_t i = index; i < run->n_runs; ++i) {
        const uint32_t stop = run->runs[i].value + run->runs[i].length;
        if (run->runs[i].value >= pos_end) break;
        if (stop >= pos_end) {
            count += (((pos_end - run->runs[i].value) > 0)
                          ? (pos_end - run->runs[i].value)
                          : 0);
            break;
        }
        const uint32_t min = (stop - pos_start) > 0 ? (stop - pos_start) : 0;
        count += (min < run->runs[i].length) ? min : run->runs[i].length;
    }
    return count >= (pos_end - pos_start - 1);
}